

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr Term_bigcurs_x11(wchar_t x,wchar_t y)

{
  void *pvVar1;
  
  pvVar1 = Term->data;
  XDrawRectangle(metadpy_default_0,Infowin->win,xor->gc,
                 (int)Infowin->ox + x * *(int *)((long)pvVar1 + 0xe8),
                 (int)Infowin->oy + y * *(int *)((long)pvVar1 + 0xf0),
                 *(int *)((long)pvVar1 + 0xec) + -1,*(int *)((long)pvVar1 + 0xf0) + -1);
  return 0;
}

Assistant:

static errr Term_bigcurs_x11(int x, int y)
{
	term_data *td = (term_data*)(Term->data);

	XDrawRectangle(Metadpy->dpy, Infowin->win, xor->gc,
				   x * td->tile_wid + Infowin->ox,
				   y * td->tile_hgt + Infowin->oy,
				   td->tile_wid2 - 1, td->tile_hgt - 1);

	/* Success */
	return (0);
}